

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O1

int s_rnge(char *var,int index,char *routine,int lineno)

{
  fprintf(_stderr,"array index out-of-bounds for %s[%d] in routine %s:%d\n",var,index,routine,
          (ulong)(uint)lineno);
  fflush(_stderr);
  __assert_fail("2+2 == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/f2c_lite.c"
                ,0x25,"int s_rnge(char *, int, char *, int)");
}

Assistant:

extern int
s_rnge(char *var, int index, char *routine, int lineno)
{
    fprintf(stderr,
            "array index out-of-bounds for %s[%d] in routine %s:%d\n", var,
            index, routine, lineno);
    fflush(stderr);
	assert(2+2 == 5);
	return 0;
}